

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall libcellml::Model::replaceUnits(Model *this,size_t index,UnitsPtr *units)

{
  bool bVar1;
  ModelImpl *pMVar2;
  ModelImpl *pMVar3;
  element_type *this_00;
  UnitsImpl *this_01;
  enable_shared_from_this<libcellml::Model> local_68;
  shared_ptr<libcellml::ParentedEntity> local_58;
  shared_ptr<libcellml::Units> *local_48;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_40;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_38;
  const_iterator local_30;
  byte local_21;
  __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_20;
  bool status;
  UnitsPtr *units_local;
  size_t index_local;
  Model *this_local;
  
  local_21 = 0;
  p_Stack_20 = (__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               units;
  units_local = (UnitsPtr *)index;
  index_local = (size_t)this;
  bVar1 = removeUnits(this,index);
  if (bVar1) {
    pMVar2 = pFunc(this);
    pMVar3 = pFunc(this);
    local_40._M_current =
         (shared_ptr<libcellml::Units> *)
         std::
         vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
         ::begin(&pMVar3->mUnits);
    local_38 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
               ::operator+(&local_40,(difference_type)units_local);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>
    ::__normal_iterator<std::shared_ptr<libcellml::Units>*>
              ((__normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>
                *)&local_30,&local_38);
    local_48 = (shared_ptr<libcellml::Units> *)
               std::
               vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
               ::insert(&pMVar2->mUnits,local_30,(value_type *)p_Stack_20);
    this_00 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(p_Stack_20);
    this_01 = Units::pFunc(this_00);
    std::enable_shared_from_this<libcellml::Model>::shared_from_this(&local_68);
    std::shared_ptr<libcellml::ParentedEntity>::shared_ptr<libcellml::Model,void>
              (&local_58,(shared_ptr<libcellml::Model> *)&local_68);
    ParentedEntity::ParentedEntityImpl::setParent((ParentedEntityImpl *)this_01,&local_58);
    std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr(&local_58);
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&local_68);
    local_21 = 1;
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool Model::replaceUnits(size_t index, const UnitsPtr &units)
{
    bool status = false;
    if (removeUnits(index)) {
        pFunc()->mUnits.insert(pFunc()->mUnits.begin() + ptrdiff_t(index), units);
        units->pFunc()->setParent(shared_from_this());
        status = true;
    }

    return status;
}